

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall
QWidgetPrivate::sendPendingMoveAndResizeEvents
          (QWidgetPrivate *this,bool recursive,bool disableUpdates)

{
  QWidget *this_00;
  long lVar1;
  QWidgetPrivate *this_01;
  uint uVar2;
  undefined7 in_register_00000011;
  bool disableUpdates_00;
  int i;
  ulong uVar3;
  long in_FS_OFFSET;
  QSize local_68;
  QSize local_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  if (((int)CONCAT71(in_register_00000011,disableUpdates) == 0) ||
     ((this_00->data->widget_attributes & 0x400) != 0)) {
    disableUpdates_00 = false;
  }
  else {
    QWidget::setAttribute(this_00,WA_UpdatesDisabled,true);
    disableUpdates_00 = true;
  }
  uVar2 = *(uint *)(*(long *)&this_00->field_0x8 + 0x240);
  if ((uVar2 & 4) != 0) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68.wd.m_i = (this->data).crect.x1.m_i;
    local_68.ht.m_i = (this->data).crect.y1.m_i;
    local_60 = local_68;
    QMoveEvent::QMoveEvent((QMoveEvent *)&local_58,(QPoint *)&local_60,(QPoint *)&local_68);
    QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_58);
    QWidget::setAttribute(this_00,WA_PendingMoveEvent,false);
    QMoveEvent::~QMoveEvent((QMoveEvent *)&local_58);
    uVar2 = *(uint *)(*(long *)&this_00->field_0x8 + 0x240);
  }
  if ((uVar2 & 8) != 0) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = QRect::size(&(this->data).crect);
    local_68.wd.m_i = -1;
    local_68.ht.m_i = -1;
    QResizeEvent::QResizeEvent((QResizeEvent *)&local_58,&local_60,&local_68);
    QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_58);
    QWidget::setAttribute(this_00,WA_PendingResizeEvent,false);
    QResizeEvent::~QResizeEvent((QResizeEvent *)&local_58);
  }
  if (disableUpdates_00 != false) {
    QWidget::setAttribute(this_00,WA_UpdatesDisabled,false);
  }
  if (recursive) {
    for (uVar3 = 0; uVar3 < *(ulong *)&this->field_0x28; uVar3 = uVar3 + 1) {
      lVar1 = *(long *)(*(long *)&this->field_0x20 + uVar3 * 8);
      if ((lVar1 != 0) &&
         (this_01 = *(QWidgetPrivate **)(lVar1 + 8), (this_01->field_0x30 & 1) != 0)) {
        sendPendingMoveAndResizeEvents(this_01,true,disableUpdates_00);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::sendPendingMoveAndResizeEvents(bool recursive, bool disableUpdates)
{
    Q_Q(QWidget);

    disableUpdates = disableUpdates && q->updatesEnabled();
    if (disableUpdates)
        q->setAttribute(Qt::WA_UpdatesDisabled);

    if (q->testAttribute(Qt::WA_PendingMoveEvent)) {
        QMoveEvent e(data.crect.topLeft(), data.crect.topLeft());
        QCoreApplication::sendEvent(q, &e);
        q->setAttribute(Qt::WA_PendingMoveEvent, false);
    }

    if (q->testAttribute(Qt::WA_PendingResizeEvent)) {
        QResizeEvent e(data.crect.size(), QSize());
        QCoreApplication::sendEvent(q, &e);
        q->setAttribute(Qt::WA_PendingResizeEvent, false);
    }

    if (disableUpdates)
        q->setAttribute(Qt::WA_UpdatesDisabled, false);

    if (!recursive)
        return;

    for (int i = 0; i < children.size(); ++i) {
        if (QWidget *child = qobject_cast<QWidget *>(children.at(i)))
            child->d_func()->sendPendingMoveAndResizeEvents(recursive, disableUpdates);
    }
}